

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O0

void vidpalset(ubyte iobyte)

{
  ubyte local_c;
  ubyte pc_colour;
  ubyte actual_colour;
  ubyte logical_colour;
  ubyte iobyte_local;
  
  vidpal[iobyte >> 4] = iobyte & 0xf;
  switch(iobyte & 0xf ^ 7) {
  case 0:
    local_c = '\a';
    break;
  case 1:
    local_c = '\x06';
    break;
  case 2:
    local_c = '\x05';
    break;
  case 3:
    local_c = '\x04';
    break;
  case 4:
    local_c = '\x03';
    break;
  case 5:
    local_c = '\x02';
    break;
  case 6:
    local_c = '\x01';
    break;
  case 7:
    local_c = '\0';
    break;
  case 8:
    local_c = '\a';
    break;
  case 9:
    local_c = '\x06';
    break;
  case 10:
    local_c = '\x05';
    break;
  case 0xb:
    local_c = '\x04';
    break;
  case 0xc:
    local_c = '\x03';
    break;
  case 0xd:
    local_c = '\x02';
    break;
  case 0xe:
    local_c = '\x01';
    break;
  case 0xf:
    local_c = '\0';
  }
  setpalette(iobyte >> 4,local_c);
  return;
}

Assistant:

void vidpalset(ubyte iobyte)     // video palette update functions
{
    ubyte logical_colour;
    ubyte actual_colour;
    ubyte pc_colour;

    logical_colour = iobyte / 0x10;   // calculate logical colour
    actual_colour = iobyte & 0xF;     // calculate actual programmed colour

    vidpal[logical_colour] = actual_colour;  // update vidpal copy of palette

    switch (actual_colour ^ 0x7)              // convert actual colour to
    {                                      // pc colour
        case 0:
            pc_colour = EGA_BLACK;
            break;
        case 1:
            pc_colour = EGA_RED;
            break;
        case 2:
            pc_colour = EGA_GREEN;
            break;
        case 3:
            pc_colour = EGA_YELLOW;
            break;
        case 4:
            pc_colour = EGA_BLUE;
            break;
        case 5:
            pc_colour = EGA_MAGENTA;
            break;
        case 6:
            pc_colour = EGA_CYAN;
            break;
        case 7:
            pc_colour = EGA_WHITE;
            break;

        case 8:
            pc_colour = EGA_BLACK;
            break;
        case 9:
            pc_colour = EGA_RED;
            break;
        case 10:
            pc_colour = EGA_GREEN;
            break;
        case 11:
            pc_colour = EGA_YELLOW;
            break;
        case 12:
            pc_colour = EGA_BLUE;
            break;
        case 13:
            pc_colour = EGA_MAGENTA;
            break;
        case 14:
            pc_colour = EGA_CYAN;
            break;
        case 15:
            pc_colour = EGA_WHITE;
            break;

    }

    setpalette(logical_colour, pc_colour); // update pc palette
}